

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_match_accel.cpp
# Opt level: O0

bool __thiscall lzham::search_accelerator::find_all_matches(search_accelerator *this,uint num_bytes)

{
  bool bVar1;
  uint uVar2;
  uint32 uVar3;
  uint uVar4;
  vector<unsigned_int> *this_00;
  node *pnVar5;
  long *plVar6;
  task_pool *this_01;
  uint in_ESI;
  void *in_RDI;
  uint thread_index_2;
  uint t_1;
  uint c2;
  uint i_4;
  uint c1;
  uint c0;
  uint thread_index_1;
  uint i_3;
  uint thread_index;
  uint i_2;
  uint bitmask;
  uint t;
  uint8 *pDict;
  scoped_perf_section sect;
  uint bytes_to_add;
  uint i_1;
  uint insert_pos;
  uint fill_lookahead_pos;
  uint i;
  void *in_stack_00000680;
  uint64 in_stack_00000688;
  search_accelerator *in_stack_00000690;
  undefined4 in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffff74;
  vector<lzham::dict_match> *in_stack_ffffffffffffff78;
  code *in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffffa4;
  uint in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  uint in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  uint local_44;
  int in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  scoped_perf_section local_29;
  uint local_28;
  uint local_24;
  uint local_20;
  uint local_1c;
  uint local_18;
  uint local_14;
  void *pData_ptr;
  bool local_1;
  
  local_14 = in_ESI;
  pData_ptr = in_RDI;
  bVar1 = vector<lzham::dict_match>::try_resize_no_construct
                    (in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                     SUB41((uint)in_stack_ffffffffffffff70 >> 0x18,0));
  if (bVar1) {
    bVar1 = vector<long>::try_resize_no_construct
                      ((vector<long> *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                       SUB41((uint)in_stack_ffffffffffffff70 >> 0x18,0));
    if (bVar1) {
      this_00 = (vector<unsigned_int> *)vector<long>::get_ptr((vector<long> *)((long)in_RDI + 0x90))
      ;
      uVar2 = vector<long>::size_in_bytes((vector<long> *)((long)in_RDI + 0x90));
      memset(this_00,0xff,(ulong)uVar2);
      *(undefined4 *)((long)in_RDI + 0x3d8) = *(undefined4 *)((long)in_RDI + 0x24);
      *(uint *)((long)in_RDI + 0x3dc) = local_14;
      *(undefined4 *)((long)in_RDI + 0x3e0) = *(undefined4 *)((long)in_RDI + 0x2c);
      *(undefined8 *)((long)in_RDI + 0x3f0) = 0;
      if (((*(long *)((long)in_RDI + 0x10) == 0) || (*(int *)((long)in_RDI + 0x18) == 0)) ||
         (local_14 < 0x400)) {
        find_all_matches_callback_st(in_stack_00000690,in_stack_00000688,in_stack_00000680);
        *(undefined8 *)((long)in_RDI + 0x3f8) = 0;
      }
      else {
        for (local_18 = local_14 - 2; local_18 < local_14; local_18 = local_18 + 1) {
          local_1c = *(int *)((long)in_RDI + 0x3d8) + local_18;
          local_20 = local_1c & *(uint *)((long)in_RDI + 0x20);
          pnVar5 = vector<lzham::node>::operator[]
                             ((vector<lzham::node> *)((long)in_RDI + 0x60),local_20);
          pnVar5->m_left = 0;
          pnVar5 = vector<lzham::node>::operator[]
                             ((vector<lzham::node> *)((long)in_RDI + 0x60),local_20);
          pnVar5->m_right = 0;
          plVar6 = vector<long>::operator[]
                             ((vector<long> *)((long)in_RDI + 0x90),
                              local_1c - *(int *)((long)in_RDI + 0x3d8));
          *plVar6 = -2;
        }
        for (local_24 = 0; local_24 < *(uint *)((long)in_RDI + 0x18); local_24 = local_24 + 1) {
          vector<unsigned_int>::try_resize
                    (this_00,in_stack_ffffffffffffff74,
                     SUB41((uint)in_stack_ffffffffffffff70 >> 0x18,0));
        }
        local_28 = local_14 - 2;
        scoped_perf_section::scoped_perf_section
                  (&local_29,cVarArgs,"****** find_all_matches_prep %u",(ulong)local_28);
        this_01 = (task_pool *)
                  vector<unsigned_char>::operator[]
                            ((vector<unsigned_char> *)((long)in_RDI + 0x30),
                             *(uint *)((long)in_RDI + 0x24) & *(uint *)((long)in_RDI + 0x20));
        if ((*(byte *)((long)in_RDI + 0x3ef) & 1) == 0) {
          in_stack_ffffffffffffffac = (uint)(byte)(this_01->m_task_stack).m_spinlock.m_spinlock;
          in_stack_ffffffffffffffa8 =
               (uint)*(byte *)((long)&(this_01->m_task_stack).m_spinlock.m_spinlock + 1);
          for (in_stack_ffffffffffffffa4 = 0; in_stack_ffffffffffffffa4 < local_28;
              in_stack_ffffffffffffffa4 = in_stack_ffffffffffffffa4 + 1) {
            uVar4 = (uint)*(byte *)((long)&(this_01->m_task_stack).m_spinlock.m_spinlock + 2);
            bitmix32((in_stack_ffffffffffffffac | in_stack_ffffffffffffffa8 << 8) ^ uVar4 << 4);
            in_stack_ffffffffffffffac = in_stack_ffffffffffffffa8;
            bVar1 = vector<unsigned_int>::try_push_back
                              (this_00,(uint *)CONCAT44(in_stack_ffffffffffffff74,
                                                        in_stack_ffffffffffffff70));
            if (!bVar1) {
              return false;
            }
            this_01 = (task_pool *)((long)&(this_01->m_task_stack).m_spinlock.m_spinlock + 1);
            in_stack_ffffffffffffffa8 = uVar4;
          }
        }
        else {
          in_stack_ffffffffffffffc4 =
               (uint)(byte)(this_01->m_task_stack).m_spinlock.m_spinlock << 8 |
               (uint)*(byte *)((long)&(this_01->m_task_stack).m_spinlock.m_spinlock + 1) << 0x10;
          bVar1 = math::is_power_of_2(*(uint32 *)((long)in_RDI + 0x18));
          if (bVar1) {
            in_stack_ffffffffffffffc0 = *(int *)((long)in_RDI + 0x18) + -1;
            for (local_44 = 0; local_44 < local_28; local_44 = local_44 + 1) {
              in_stack_ffffffffffffffc4 =
                   in_stack_ffffffffffffffc4 >> 8 |
                   (uint)*(byte *)((long)&(this_01->m_task_stack).m_spinlock.m_spinlock + 2) << 0x10
              ;
              bitmix32(in_stack_ffffffffffffffc4);
              bVar1 = vector<unsigned_int>::try_push_back
                                (this_00,(uint *)CONCAT44(in_stack_ffffffffffffff74,
                                                          in_stack_ffffffffffffff70));
              if (!bVar1) {
                return false;
              }
              this_01 = (task_pool *)((long)&(this_01->m_task_stack).m_spinlock.m_spinlock + 1);
            }
          }
          else {
            for (in_stack_ffffffffffffffb4 = 0; in_stack_ffffffffffffffb4 < local_28;
                in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb4 + 1) {
              in_stack_ffffffffffffffc4 =
                   in_stack_ffffffffffffffc4 >> 8 |
                   (uint)*(byte *)((long)&(this_01->m_task_stack).m_spinlock.m_spinlock + 2) << 0x10
              ;
              uVar3 = bitmix32(in_stack_ffffffffffffffc4);
              in_stack_ffffffffffffffb0 = uVar3 % *(uint *)((long)in_RDI + 0x18);
              bVar1 = vector<unsigned_int>::try_push_back
                                (this_00,(uint *)CONCAT44(in_stack_ffffffffffffff74,
                                                          in_stack_ffffffffffffff70));
              if (!bVar1) {
                return false;
              }
              this_01 = (task_pool *)((long)&(this_01->m_task_stack).m_spinlock.m_spinlock + 1);
            }
          }
        }
        *(undefined8 *)((long)in_RDI + 0x3f8) = 0;
        in_stack_ffffffffffffff88 = find_all_matches_callback_mt;
        bVar1 = task_pool::
                queue_multiple_object_tasks<lzham::search_accelerator,void(lzham::search_accelerator::*)(unsigned_long_long,void*)>
                          (this_01,(search_accelerator *)
                                   CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                           CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                           CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                           in_stack_ffffffffffffffa4,pData_ptr);
        if (!bVar1) {
          return false;
        }
      }
      if ((*(byte *)((long)in_RDI + 0x3ee) & 1) == 0) {
        local_1 = true;
      }
      else {
        local_1 = find_len2_matches((search_accelerator *)in_stack_ffffffffffffff88);
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool search_accelerator::find_all_matches(uint num_bytes)
   {
      if (!m_matches.try_resize_no_construct(m_max_probes * num_bytes))
      {
         LZHAM_LOG_ERROR(9006);
         return false;
      }

      if (!m_match_refs.try_resize_no_construct(num_bytes))
      {
         LZHAM_LOG_ERROR(9007);
         return false;
      }

      memset(m_match_refs.get_ptr(), 0xFF, m_match_refs.size_in_bytes());

      m_fill_lookahead_pos = m_lookahead_pos;
      m_fill_lookahead_size = num_bytes;
      m_fill_dict_size = m_cur_dict_size;

      m_next_match_ref = 0;

      if ((!m_pTask_pool) || (m_max_helper_threads < 1) || (num_bytes < 1024))
      {
         find_all_matches_callback_st(0, NULL);
         
         m_num_completed_helper_threads = 0;
      }
      else
      {
         for (uint i = num_bytes - 2; i < num_bytes; i++)
         {
            uint fill_lookahead_pos = m_fill_lookahead_pos + i;
            uint insert_pos = fill_lookahead_pos & m_max_dict_size_mask;
            m_nodes[insert_pos].m_left = 0;
            m_nodes[insert_pos].m_right = 0;

            m_match_refs[static_cast<uint>(fill_lookahead_pos - m_fill_lookahead_pos)] = -2;
         }

         for (uint i = 0; i < m_max_helper_threads; i++)
            m_thread_dict_offsets[i].try_resize(0);

         uint bytes_to_add = num_bytes - 2;

         scoped_perf_section sect(cVarArgs, "****** find_all_matches_prep %u", bytes_to_add);
                       
         const uint8* pDict = &m_dict[m_lookahead_pos & m_max_dict_size_mask];
                     
         if (m_hash24)
         {
            uint t = (pDict[0] << 8) | (pDict[1] << 16);

            if (math::is_power_of_2(m_max_helper_threads))
            {
               const uint bitmask = (m_max_helper_threads - 1);
               for (uint i = 0; i < bytes_to_add; i++)
               {
                  t = (t >> 8) | (pDict[2] << 16);

                  LZHAM_ASSERT(t == LZHAM_HASH3_24(pDict[0], pDict[1], pDict[2]));

                  uint thread_index = bitmix32(t) & bitmask;

                  if (!m_thread_dict_offsets[thread_index].try_push_back(i))
                  {
                     LZHAM_LOG_ERROR(9008);
                     return false;
                  }

                  pDict++;
               }
            }
            else
            {
               for (uint i = 0; i < bytes_to_add; i++)
               {
                  t = (t >> 8) | (pDict[2] << 16);

                  LZHAM_ASSERT(t == LZHAM_HASH3_24(pDict[0], pDict[1], pDict[2]));

                  uint thread_index = bitmix32(t) % m_max_helper_threads;

                  if (!m_thread_dict_offsets[thread_index].try_push_back(i))
                  {
                     LZHAM_LOG_ERROR(9009);
                     return false;
                  }

                  pDict++;
               }
            }
         }
         else
         {
            uint c0 = pDict[0];
            uint c1 = pDict[1];
                  
            for (uint i = 0; i < bytes_to_add; i++)
            {
               uint c2 = pDict[2];
               
               uint t = LZHAM_HASH3_16(c0, c1, c2);

               c0 = c1;
               c1 = c2;
                                                            
               uint thread_index = bitmix32(t) % m_max_helper_threads;

               if (!m_thread_dict_offsets[thread_index].try_push_back(i))
               {
                  LZHAM_LOG_ERROR(9010);
                  return false;
               }
               
               pDict++;
            }
         }
         
         m_num_completed_helper_threads = 0;
         
         if (!m_pTask_pool->queue_multiple_object_tasks(this, &search_accelerator::find_all_matches_callback_mt, 0, m_max_helper_threads))
         {
            LZHAM_LOG_ERROR(9011);
            return false;
         }
      }

      return m_len2_matches ? find_len2_matches() : true;
   }